

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  Ch CVar1;
  bool bVar2;
  Ch *begin;
  size_t sVar3;
  bool local_a2;
  Ch *str;
  size_t length;
  Ch *head;
  bool success;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *s;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> copy;
  bool isKey_local;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *handler_local;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *is_local;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  copy.original_._7_1_ = isKey;
  internal::StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>::
  StreamLocalCopy((StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>
                   *)&s,is);
  CVar1 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek
                    ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&s);
  if (CVar1 != '\"') {
    __assert_fail("s.Peek() == \'\\\"\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                  ,0x3c2,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseString(InputStream &, Handler &, bool) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  GenericInsituStringStream<rapidjson::UTF8<char>_>::Take
            ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&s);
  begin = GenericInsituStringStream<rapidjson::UTF8<char>_>::PutBegin
                    ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&s);
  ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
            (this,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)&s,
             (GenericInsituStringStream<rapidjson::UTF8<char>_> *)&s);
  bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)this);
  if (!bVar2) {
    sVar3 = GenericInsituStringStream<rapidjson::UTF8<char>_>::PutEnd
                      ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&s,begin);
    if (0xffffffff < sVar3 - 1) {
      __assert_fail("length <= 0xFFFFFFFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x3cb,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseString(InputStream &, Handler &, bool) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    str._0_4_ = (SizeType)(sVar3 - 1);
    if ((copy.original_._7_1_ & 1) == 0) {
      local_a2 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::String(handler,begin,(SizeType)str,false);
    }
    else {
      local_a2 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Key(handler,begin,(SizeType)str,false);
    }
    if (((local_a2 ^ 0xffU) & 1) != 0) {
      bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x3d8,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseString(InputStream &, Handler &, bool) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      sVar3 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell
                        ((GenericInsituStringStream<rapidjson::UTF8<char>_> *)&s);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this,kParseErrorTermination,sVar3);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this);
    }
  }
  internal::StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>::
  ~StreamLocalCopy((StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1>
                    *)&s);
  return;
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }